

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_extensions.cpp
# Opt level: O3

void __thiscall
ONX_ModelTest::Internal_ReadTest
          (ONX_ModelTest *this,ON_BinaryArchive *archive,Type test_type,bool bKeepModels,
          wchar_t *text_log_file_path,ON_TextLog *text_log)

{
  long lVar1;
  ON__UINT8 *pOVar2;
  uint version;
  byte bVar3;
  bool bVar4;
  byte bVar5;
  int iVar6;
  archive_mode aVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  ON_wString *pOVar12;
  ONX_Model *pOVar13;
  char *pcVar14;
  undefined7 in_register_00000009;
  ON_Buffer *pOVar15;
  uint count0_1;
  long lVar16;
  ON_TextLog *error_log;
  uint count0_5;
  ON_wString *src;
  uint count0;
  uint *puVar17;
  bool bVar18;
  ON_String read0_description;
  ON_String text_log_3dm_archive_name;
  uint temporary_buffer_3dm_version [2];
  shared_ptr<ONX_Model> model1_sp;
  ON_String write1_description;
  ON_String read1_description;
  shared_ptr<ONX_Model> model0_sp;
  ON_Buffer temporary_buffer [2];
  ON_BinaryArchiveBuffer temporary_archive;
  ON_TextLogNull devnull;
  ON_TextLog *local_3e8;
  uint local_3d4;
  ON_String local_3c0;
  ON_String local_3b8;
  undefined4 local_3ac;
  uint local_3a8 [2];
  long local_3a0;
  ONX_ErrorCounter *local_398;
  long local_390;
  ONX_Model *local_388;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_380;
  ON_SHA1_Hash *local_378;
  ON_Buffer *local_370;
  ON_SHA1_Hash local_368;
  ON_String local_350;
  ONX_Model *local_348;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_340;
  ON_Buffer local_338 [2];
  ON_BinaryArchiveBuffer local_2b0;
  ON_TextLog local_a8;
  
  local_3ac = (undefined4)CONCAT71(in_register_00000009,bKeepModels);
  this->m_test_type = test_type;
  error_log = (ON_TextLog *)text_log_file_path;
  pOVar12 = ON_BinaryArchive::ArchiveFullPath(archive);
  ON_wString::operator=(&this->m_source_3dm_file_path,pOVar12);
  pOVar12 = &this->m_text_log_3dm_file_path;
  ON_wString::operator=(pOVar12,text_log_file_path);
  iVar6 = ON_BinaryArchive::CurrentArchiveVersion();
  ON_TextLog::ON_TextLog(&local_a8);
  local_a8._vptr_ON_TextLog = (_func_int **)&PTR__ON_TextLog_0080f548;
  local_3e8 = text_log;
  if (text_log == (ON_TextLog *)0x0) {
    local_3e8 = &ON_TextLog::Null;
  }
  Internal_BeginNextTest(this,Read);
  aVar7 = ON_BinaryArchive::Mode(archive);
  if (aVar7 == read3dm) {
    pOVar13 = (ONX_Model *)onmalloc(0xb88);
    ONX_Model::ONX_Model(pOVar13);
    local_348 = pOVar13;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<ONX_Model*>(&local_340,pOVar13);
    if ((char)local_3ac != '\0') {
      this->m_model[0].super___shared_ptr<ONX_Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_348;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&this->m_model[0].super___shared_ptr<ONX_Model,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,&local_340);
    }
    bVar4 = ON_wString::IsNotEmpty(pOVar12);
    src = &this->m_source_3dm_file_path;
    if (bVar4) {
      src = pOVar12;
    }
    ON_wString::ON_wString((ON_wString *)&local_2b0,src);
    ON_String::ON_String(&local_3b8,(ON_wString *)&local_2b0);
    ON_wString::~ON_wString((ON_wString *)&local_2b0);
    bVar4 = ON_String::IsEmpty(&local_3b8);
    if (bVar4) {
      ON_String::operator=(&local_3b8,"archive");
    }
    pcVar14 = ON_String::operator_cast_to_char_(&local_3b8);
    ON_String::FormatToString((char *)&local_3c0,"ONX_Model.Read(%s,...)",pcVar14);
    pcVar14 = ON_String::operator_cast_to_char_(&local_3c0);
    ON_TextLog::Print(local_3e8,"Calling %s ...\n",pcVar14);
    ON_TextLog::PushIndent(local_3e8);
    iVar8 = ON_GetErrorCount();
    iVar9 = ON_GetWarningCount();
    bVar4 = ONX_Model::Read(pOVar13,archive,0,0,error_log);
    iVar10 = ON_GetErrorCount();
    iVar11 = ON_GetWarningCount();
    this->m_model_3dm_file_version[0] = pOVar13->m_3dm_file_version;
    ON_TextLog::PopIndent(local_3e8);
    if (bVar4) {
      pcVar14 = ON_String::operator_cast_to_char_(&local_3c0);
      ON_TextLog::Print(local_3e8,"... %s ",pcVar14);
      if ((iVar10 - iVar8) + (iVar11 - iVar9) == 0) {
        ON_TextLog::Print(local_3e8,"succeeded.");
      }
      else {
        ON_TextLog::Print(local_3e8,"finished. ");
        error_log = (ON_TextLog *)(ulong)(uint)(iVar11 - iVar9);
        ON_TextLog::Print(local_3e8,"%u failures, %u errors, %u warnings",0,
                          (ulong)(uint)(iVar10 - iVar8));
      }
      ON_TextLog::PrintNewLine(local_3e8);
      ON_TextLog::PushIndent(local_3e8);
      ON_TextLog::Print(local_3e8,"Source model 3dm file version: %d",
                        (ulong)(uint)pOVar13->m_3dm_file_version);
      ON_TextLog::PrintNewLine(local_3e8);
      ONX_Model::ContentHash((ON_SHA1_Hash *)&local_2b0,pOVar13);
      *(int *)(this->m_model_hash[0].m_digest + 0x10) =
           local_2b0.super_ON_BinaryArchive.m_3dm_v1_material_index;
      *(undefined4 *)this->m_model_hash[0].m_digest =
           local_2b0.super_ON_BinaryArchive._vptr_ON_BinaryArchive._0_4_;
      *(undefined4 *)(this->m_model_hash[0].m_digest + 4) =
           local_2b0.super_ON_BinaryArchive._vptr_ON_BinaryArchive._4_4_;
      *(int *)(this->m_model_hash[0].m_digest + 8) = local_2b0.super_ON_BinaryArchive.m_3dm_version;
      *(int *)(this->m_model_hash[0].m_digest + 0xc) =
           local_2b0.super_ON_BinaryArchive.m_3dm_v1_layer_index;
      ON_TextLog::Print(local_3e8,"Source model hash: ");
      ON_SHA1_Hash::Dump(this->m_model_hash,local_3e8);
      ON_TextLog::PrintNewLine(local_3e8);
      ON_TextLog::PopIndent(local_3e8);
      if (test_type != Read) {
        Internal_EndCurrentTest(this);
        Internal_BeginNextTest(this,ReadWrite);
        pOVar15 = local_338;
        ON_Buffer::ON_Buffer(pOVar15);
        local_378 = this->m_model_hash;
        ON_Buffer::ON_Buffer(local_338 + 1);
        local_3a8[0] = iVar6 - 10;
        local_398 = this->m_error_counts;
        puVar17 = local_3a8;
        bVar5 = 1;
        local_3a8[1] = iVar6;
        do {
          ON_BinaryArchiveBuffer::ON_BinaryArchiveBuffer(&local_2b0,write3dm,pOVar15);
          version = *puVar17;
          ON_String::FormatToString
                    ((char *)&local_368,"ONX_Model.Write( temporary_archive version %d, ...)",
                     (ulong)version);
          pcVar14 = ON_String::operator_cast_to_char_((ON_String *)&local_368);
          ON_TextLog::Print(local_3e8,"Calling %s ...\n",pcVar14);
          ON_TextLog::PushIndent(local_3e8);
          iVar6 = ON_GetErrorCount();
          iVar8 = ON_GetWarningCount();
          bVar4 = ONX_Model::Write(pOVar13,&local_2b0.super_ON_BinaryArchive,version,local_3e8);
          iVar9 = ON_GetErrorCount();
          iVar10 = ON_GetWarningCount();
          ON_TextLog::PopIndent(local_3e8);
          if (bVar4) {
            pcVar14 = ON_String::operator_cast_to_char_((ON_String *)&local_368);
            ON_TextLog::Print(local_3e8,"... %s ",pcVar14);
            if ((iVar9 - iVar6) + (iVar10 - iVar8) == 0) {
              ON_TextLog::Print(local_3e8,"succeeded.");
            }
            else {
              ON_TextLog::Print(local_3e8,"finished. ");
              error_log = (ON_TextLog *)(ulong)(uint)(iVar10 - iVar8);
              ON_TextLog::Print(local_3e8,"%u failures, %u errors, %u warnings",0);
            }
            ON_TextLog::PrintNewLine(local_3e8);
          }
          else {
            local_398[this->m_current_test_index].m_failure_count =
                 local_398[this->m_current_test_index].m_failure_count + 1;
            pcVar14 = ON_String::operator_cast_to_char_((ON_String *)&local_368);
            ON_TextLog::Print(local_3e8,"%s failed.\n",pcVar14);
          }
          ON_String::~ON_String((ON_String *)&local_368);
          ON_BinaryArchiveBuffer::~ON_BinaryArchiveBuffer(&local_2b0);
          puVar17 = local_3a8 + 1;
          pOVar15 = local_338 + 1;
          bVar3 = bVar5 & bVar4;
          bVar5 = 0;
        } while (bVar3 != 0);
        if (test_type != ReadWrite) {
          Internal_EndCurrentTest(this);
          Internal_BeginNextTest(this,ReadWriteRead);
          local_390 = 0x108;
          pOVar15 = local_338;
          local_3a0 = 0x134;
          local_3d4 = 1;
          lVar16 = 0;
          do {
            if (lVar16 == 8) break;
            local_370 = pOVar15;
            ON_BinaryArchiveBuffer::ON_BinaryArchiveBuffer(&local_2b0,read3dm,pOVar15);
            ON_String::FormatToString
                      ((char *)&local_350,"ONX_Model.Read( temporary_archive version %d, ...)",
                       (ulong)*(uint *)((long)local_3a8 + lVar16));
            pcVar14 = ON_String::operator_cast_to_char_(&local_350);
            ON_TextLog::Print(local_3e8,"Calling %s ...\n",pcVar14);
            ON_TextLog::PushIndent(local_3e8);
            pOVar13 = (ONX_Model *)onmalloc(0xb88);
            ONX_Model::ONX_Model(pOVar13);
            local_388 = pOVar13;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<ONX_Model*>
                      (&local_380,pOVar13);
            if ((char)local_3ac != '\0') {
              *(ONX_Model **)
               ((long)&this->m_model[1].super___shared_ptr<ONX_Model,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr + lVar16 * 4) = local_388;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                         ((long)this->m_model_3dm_file_version + local_390 + -0x18),&local_380);
            }
            iVar6 = ON_GetErrorCount();
            iVar8 = ON_GetWarningCount();
            bVar4 = ONX_Model::Read(pOVar13,&local_2b0.super_ON_BinaryArchive,0,0,error_log);
            iVar9 = ON_GetErrorCount();
            iVar10 = ON_GetWarningCount();
            *(int *)((long)this->m_model_3dm_file_version + lVar16 + 4) =
                 pOVar13->m_3dm_file_version;
            ON_TextLog::PopIndent(local_3e8);
            if (bVar4) {
              pcVar14 = ON_String::operator_cast_to_char_(&local_350);
              ON_TextLog::Print(local_3e8,"... %s ",pcVar14);
              if ((iVar9 - iVar6) + (iVar10 - iVar8) == 0) {
                ON_TextLog::Print(local_3e8,"succeeded.");
              }
              else {
                ON_TextLog::Print(local_3e8,"finished. ");
                error_log = (ON_TextLog *)(ulong)(uint)(iVar10 - iVar8);
                ON_TextLog::Print(local_3e8,"%u failures, %u errors, %u warnings",0,
                                  (ulong)(uint)(iVar9 - iVar6));
              }
              ON_TextLog::PrintNewLine(local_3e8);
              ON_TextLog::PushIndent(local_3e8);
              ON_TextLog::Print(local_3e8,"Temporary model %d 3dm file version: %d",(ulong)local_3d4
                                ,(ulong)(uint)pOVar13->m_3dm_file_version);
              ON_TextLog::PrintNewLine(local_3e8);
              ONX_Model::ContentHash(&local_368,pOVar13);
              *(undefined4 *)((long)this->m_model_3dm_file_version + local_3a0 + -8) =
                   local_368.m_digest._16_4_;
              pOVar2 = (ON__UINT8 *)((long)this->m_model_3dm_file_version + local_3a0 + -0x18);
              *(undefined4 *)pOVar2 = local_368.m_digest._0_4_;
              *(undefined4 *)(pOVar2 + 4) = local_368.m_digest._4_4_;
              *(undefined4 *)(pOVar2 + 8) = local_368.m_digest._8_4_;
              *(undefined4 *)(pOVar2 + 0xc) = local_368.m_digest._12_4_;
              ON_TextLog::Print(local_3e8,"Temporary model %d hash: ",(ulong)local_3d4);
              ON_SHA1_Hash::Dump((ON_SHA1_Hash *)
                                 ((long)this->m_model_3dm_file_version + local_3a0 + -0x18),
                                 local_3e8);
              ON_TextLog::PrintNewLine(local_3e8);
              ON_TextLog::PopIndent(local_3e8);
            }
            else {
              local_398[this->m_current_test_index].m_failure_count =
                   local_398[this->m_current_test_index].m_failure_count + 1;
              pcVar14 = ON_String::operator_cast_to_char_(&local_350);
              ON_TextLog::Print(local_3e8,"%s failed.\n",pcVar14);
            }
            if (local_380._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_380._M_pi);
            }
            ON_String::~ON_String(&local_350);
            ON_BinaryArchiveBuffer::~ON_BinaryArchiveBuffer(&local_2b0);
            lVar16 = lVar16 + 4;
            local_390 = local_390 + 0x10;
            pOVar15 = local_370 + 1;
            local_3a0 = local_3a0 + 0x14;
            local_3d4 = local_3d4 + 1;
          } while (bVar4);
          Internal_EndCurrentTest(this);
          Internal_BeginNextTest(this,ReadWriteReadCompare);
          bVar4 = true;
          lVar16 = 0;
          do {
            while ((this->m_model_3dm_file_version[0] != this->m_model_3dm_file_version[lVar16 + 1]
                   || (this->m_model_3dm_file_version[0] != local_3a8[lVar16]))) {
              bVar18 = lVar16 != 0;
              lVar16 = 1;
              if (bVar18) {
                if (bVar4) {
                  this->m_test_results[this->m_current_test_index] = Skip;
                }
                goto LAB_004679f7;
              }
            }
            lVar1 = lVar16 + 1;
            bVar4 = ::operator!=(local_378,local_378 + lVar1);
            if (bVar4) {
              local_398[this->m_current_test_index].m_failure_count =
                   local_398[this->m_current_test_index].m_failure_count + 1;
              ON_TextLog::Print(local_3e8,"The source model and temporary model %d are different.\n"
                                ,lVar1);
              break;
            }
            ON_TextLog::Print(local_3e8,"The source model and temporary model %d are identical.\n",
                              lVar1);
            bVar4 = false;
            bVar18 = lVar16 == 0;
            lVar16 = 1;
          } while (bVar18);
        }
LAB_004679f7:
        lVar16 = 0x40;
        do {
          ON_Buffer::~ON_Buffer((ON_Buffer *)(local_338[0].m_reserved + lVar16 + -0x34));
          lVar16 = lVar16 + -0x40;
        } while (lVar16 != -0x40);
      }
    }
    else {
      this->m_error_counts[this->m_current_test_index].m_failure_count =
           this->m_error_counts[this->m_current_test_index].m_failure_count + 1;
      pcVar14 = ON_String::operator_cast_to_char_(&local_3c0);
      ON_TextLog::Print(local_3e8,"%s failed.\n",pcVar14);
    }
    ON_String::~ON_String(&local_3c0);
    ON_String::~ON_String(&local_3b8);
    if (local_340._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_340._M_pi);
    }
  }
  else {
    this->m_error_counts[0].m_failure_count = this->m_error_counts[0].m_failure_count + 1;
    ON_TextLog::Print(local_3e8,"archive.Mode() must be ON::archive_mode::read3dm.");
  }
  Internal_EndCurrentTest(this);
  ON_TextLog::~ON_TextLog(&local_a8);
  return;
}

Assistant:

void ONX_ModelTest::Internal_ReadTest(
  ON_BinaryArchive& archive,
  ONX_ModelTest::Type test_type,
  bool bKeepModels,
  const wchar_t* text_log_file_path,
  ON_TextLog* text_log
)
{
  m_test_type = test_type;
  m_source_3dm_file_path = archive.ArchiveFullPath();
  m_text_log_3dm_file_path = text_log_file_path;

  const unsigned int current_3dm_file_version = (unsigned int)ON_BinaryArchive::CurrentArchiveVersion();

  ON_TextLogNull devnull;
  if (nullptr == text_log)
    text_log = &ON_TextLog::Null;

  for (;;)
  {
    Internal_BeginNextTest(ONX_ModelTest::Type::Read);

    if ( ON::archive_mode::read3dm != archive.Mode() )
    {
      m_error_counts[0].IncrementFailureCount();
      text_log->Print("archive.Mode() must be ON::archive_mode::read3dm.");
      break;
    }

    ONX_Model* model0 = new ONX_Model();
    std::shared_ptr<ONX_Model> model0_sp = std::shared_ptr<ONX_Model>(model0);
    if (bKeepModels)
      this->m_model[0] = model0_sp;

    ON_String text_log_3dm_archive_name = TextLogSource3dmFilePath();
    if (text_log_3dm_archive_name.IsEmpty())
    {
      text_log_3dm_archive_name = "archive";
    }

    const ON_String read0_description
      = ON_String::FormatToString("ONX_Model.Read(%s,...)", static_cast<const char*>(text_log_3dm_archive_name));

    // read the original file
    text_log->Print("Calling %s ...\n", static_cast<const char*>(read0_description));
    text_log->PushIndent();
    ONX_ErrorCounter read0_error_counter;
    read0_error_counter.ClearLibraryErrorsAndWarnings();
    const bool bRead0 = model0->Read(archive, text_log);
    read0_error_counter.AddLibraryErrorsAndWarnings();
    m_model_3dm_file_version[0] = model0->m_3dm_file_version;

    text_log->PopIndent();

    if (false == bRead0)
    {
      m_error_counts[m_current_test_index].IncrementFailureCount();
      text_log->Print("%s failed.\n", static_cast<const char*>(read0_description));
      break;
    }
    else
    {
      text_log->Print("... %s ", static_cast<const char*>(read0_description));
      if ( 0 == read0_error_counter.TotalCount() )
        text_log->Print("succeeded.");
      else
      {
        text_log->Print("finished. ");
        read0_error_counter.Dump(*text_log);
      }
      text_log->PrintNewLine();

    }
    text_log->PushIndent();
    text_log->Print("Source model 3dm file version: %d", model0->m_3dm_file_version);
    text_log->PrintNewLine();
    m_model_hash[0] = model0->ContentHash();
    text_log->Print("Source model hash: ");
    m_model_hash[0].Dump(*text_log);
    text_log->PrintNewLine();
    text_log->PopIndent();

    if ( ONX_ModelTest::Type::Read == test_type)
      break;
    Internal_EndCurrentTest();
    Internal_BeginNextTest(ONX_ModelTest::Type::ReadWrite);

    //const unsigned int original_model_3dm_file_version = (unsigned int)(model0->m_3dm_file_version);

    // Write original_model to a termporary archive using "buffer" for storage. 
    ON_Buffer temporary_buffer[2];
    const unsigned int temporary_buffer_3dm_version[2] = { current_3dm_file_version - 10, current_3dm_file_version };

    for (int buffer_index = 0; buffer_index < 2; buffer_index++)
    {
      ON_BinaryArchiveBuffer temporary_archive(ON::archive_mode::write3dm, &temporary_buffer[buffer_index]);

      const ON_String write1_description
        = ON_String::FormatToString(
          "ONX_Model.Write( temporary_archive version %d, ...)",
          temporary_buffer_3dm_version[buffer_index]);

      text_log->Print("Calling %s ...\n", static_cast<const char*>(write1_description));
      text_log->PushIndent();
      ONX_ErrorCounter write1_error_counter;
      write1_error_counter.ClearLibraryErrorsAndWarnings();
      bool bWrite1 = model0->Write(temporary_archive, temporary_buffer_3dm_version[buffer_index], text_log);
      write1_error_counter.AddLibraryErrorsAndWarnings();
      text_log->PopIndent();

      if (false == bWrite1)
      {
        m_error_counts[m_current_test_index].IncrementFailureCount();
        text_log->Print("%s failed.\n", static_cast<const char*>(write1_description));
        break;
      }
      else
      {
        text_log->Print("... %s ", static_cast<const char*>(write1_description));
        if ( 0 == write1_error_counter.TotalCount() )
          text_log->Print("succeeded.");
        else
        {
          text_log->Print("finished. ");
          write1_error_counter.Dump(*text_log);
        }
        text_log->PrintNewLine();
      }
    }

    // no longer need model0
    model0 = nullptr;

    if ( ONX_ModelTest::Type::ReadWrite == test_type)
      break;
    Internal_EndCurrentTest();
    Internal_BeginNextTest(ONX_ModelTest::Type::ReadWriteRead);

    // read models from the temporary archives
    for (int buffer_index = 0; buffer_index < 2; buffer_index++)
    {
      ON_BinaryArchiveBuffer temporary_archive(ON::archive_mode::read3dm, &temporary_buffer[buffer_index]);
      const ON_String read1_description
        = ON_String::FormatToString(
          "ONX_Model.Read( temporary_archive version %d, ...)",
          temporary_buffer_3dm_version[buffer_index]);

      text_log->Print("Calling %s ...\n", static_cast<const char*>(read1_description));
      text_log->PushIndent();

      ONX_Model* model1 = new ONX_Model();
      std::shared_ptr<ONX_Model> model1_sp = std::shared_ptr<ONX_Model>(model1);
      if (bKeepModels)
        this->m_model[buffer_index+1] = model1_sp;

      ONX_ErrorCounter read1_error_counter;
      read1_error_counter.ClearLibraryErrorsAndWarnings();
      const bool bRead1 = model1->Read(temporary_archive, text_log);
      read1_error_counter.AddLibraryErrorsAndWarnings();      
      m_model_3dm_file_version[buffer_index + 1] = model1->m_3dm_file_version;

      text_log->PopIndent();

      if (false == bRead1)
      {
        m_error_counts[m_current_test_index].IncrementFailureCount();
        text_log->Print("%s failed.\n", static_cast<const char*>(read1_description));
        break;
      }
      else
      {
        text_log->Print("... %s ", static_cast<const char*>(read1_description));
        if ( 0 == read1_error_counter.TotalCount())
          text_log->Print("succeeded.");
        else
        {
          text_log->Print("finished. ");
          read1_error_counter.Dump(*text_log);
        }
        text_log->PrintNewLine();
      }
      text_log->PushIndent();
      text_log->Print("Temporary model %d 3dm file version: %d",buffer_index+1,model1->m_3dm_file_version);
      text_log->PrintNewLine();
      m_model_hash[buffer_index+1] = model1->ContentHash();
      text_log->Print("Temporary model %d hash: ",buffer_index+1);
      m_model_hash[buffer_index+1].Dump(*text_log);
      text_log->PrintNewLine();
      text_log->PopIndent();
    }

    if ( ONX_ModelTest::Type::ReadWrite == test_type)
      break;
    Internal_EndCurrentTest();
    Internal_BeginNextTest(ONX_ModelTest::Type::ReadWriteReadCompare);

    bool bSkippedCompare = true;
    for (int buffer_index = 0; buffer_index < 2; buffer_index++)
    {
      if (m_model_3dm_file_version[0] != m_model_3dm_file_version[buffer_index+1])
        continue;
      if (m_model_3dm_file_version[0] != temporary_buffer_3dm_version[buffer_index])
        continue;

      bSkippedCompare = false;
      if (m_model_hash[0] != m_model_hash[buffer_index+1])
      {
        m_error_counts[m_current_test_index].IncrementFailureCount();
        text_log->Print("The source model and temporary model %d are different.\n",buffer_index+1);
        break;
      }
      else
      {
        text_log->Print("The source model and temporary model %d are identical.\n",buffer_index+1);
      }
    }

    unsigned int compare_test_index = m_current_test_index;
    if (bSkippedCompare)
      this->m_test_results[compare_test_index] = ONX_ModelTest::Result::Skip;
            
    break;
  }

  Internal_EndCurrentTest();
}